

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

void __thiscall
Bitmap_Operation::BitmapCoreHeader::set
          (BitmapCoreHeader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t offset;
  size_t *in_stack_ffffffffffffffd8;
  
  get_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x10d674);
  get_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x10d68c);
  get_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x10d6a4);
  get_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x10d6bc);
  get_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x10d6d4);
  return;
}

Assistant:

void set( const std::vector < uint8_t > & data )
        {
            size_t offset = 0;
            get_value( data, offset, bcSize );
            get_value( data, offset, bcWidth );
            get_value( data, offset, bcHeight );
            get_value( data, offset, bcPlanes );
            get_value( data, offset, bcBitCount );
        }